

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

string * strToUpperCase(string *__return_storage_ptr__,string *src)

{
  CaseChanger<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3c;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined1 local_19;
  string *local_18;
  string *src_local;
  string *res;
  
  local_19 = 0;
  local_18 = src;
  src_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)src);
  local_28._M_current = (char *)std::__cxx11::string::begin();
  local_30._M_current = (char *)std::__cxx11::string::end();
  local_38._M_current = (char *)std::__cxx11::string::begin();
  CaseChanger<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  CaseChanger(&local_3c,ctUpper);
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CaseChanger<std::__cxx11::string>>
            (local_28,local_30,local_38,local_3c);
  return __return_storage_ptr__;
}

Assistant:

string strToUpperCase(const string& src)
{
    string res = src;

    transform(res.begin(), res.end(), res.begin(), CaseChanger<string>(CaseType::ctUpper));

    return res;
}